

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureBufferSizeQueryCase::iterate
          (TextureBufferSizeQueryCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  GLenum GVar6;
  undefined4 extraout_var;
  undefined8 *puVar7;
  long *plVar8;
  NotSupportedError *this_00;
  size_type *psVar9;
  ulong uVar10;
  undefined8 uVar11;
  GLuint buffer;
  GLuint texture;
  CallLogWrapper gl;
  ScopedLogSection section;
  GLuint texture_1;
  ResultCollector result;
  string local_160;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  string local_120;
  string local_100;
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  GLuint local_bc;
  ScopedLogSection local_b8;
  CallLogWrapper local_b0;
  ScopedLogSection local_98;
  GLuint local_8c;
  code *local_88;
  GLenum local_80;
  ResultCollector local_78;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar4) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar4) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0x1f1);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_b0,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_78,pTVar3,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  local_b0.m_enableLog = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"NonBuffer","");
  paVar2 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Non-buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_160,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGenTextures(&local_b0,1,(GLuint *)&local_b8);
  glu::CallLogWrapper::glBindTexture(&local_b0,0xde1,(GLuint)local_b8.m_log);
  glu::CallLogWrapper::glTexStorage2D(&local_b0,0xde1,1,0x8058,0x20,0x20);
  GVar6 = glu::CallLogWrapper::glGetError(&local_b0);
  if (GVar6 != 0) {
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Got Error ","");
    local_88 = glu::getErrorName;
    local_80 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_88);
    uVar10 = 0xf;
    if (local_e0 != local_d0) {
      uVar10 = local_d0[0];
    }
    if (uVar10 < local_100._M_string_length + local_d8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar11 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_100._M_string_length + local_d8) goto LAB_01631464;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
    }
    else {
LAB_01631464:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_130 = *plVar8;
      uStack_128 = puVar7[3];
    }
    else {
      local_130 = *plVar8;
      local_140 = (long *)*puVar7;
    }
    local_138 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160.field_2._8_8_ = plVar8[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_160._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
  }
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&local_78,&local_b0,0xde1,0,0x919e,0,this->m_type);
  glu::CallLogWrapper::glDeleteTextures(&local_b0,1,(GLuint *)&local_b8);
  tcu::TestLog::endSection(local_98.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Buffer","");
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Texture buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_160,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGenTextures(&local_b0,1,&local_8c);
  glu::CallLogWrapper::glBindTexture(&local_b0,0x8c2a,local_8c);
  GVar6 = glu::CallLogWrapper::glGetError(&local_b0);
  if (GVar6 != 0) {
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Got Error ","");
    local_88 = glu::getErrorName;
    local_80 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_88);
    uVar10 = 0xf;
    if (local_e0 != local_d0) {
      uVar10 = local_d0[0];
    }
    if (uVar10 < local_100._M_string_length + local_d8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar11 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_100._M_string_length + local_d8) goto LAB_016317b6;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
    }
    else {
LAB_016317b6:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_130 = *plVar8;
      uStack_128 = puVar7[3];
    }
    else {
      local_130 = *plVar8;
      local_140 = (long *)*puVar7;
    }
    local_138 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160.field_2._8_8_ = plVar8[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_160._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
  }
  glu::CallLogWrapper::glGenBuffers(&local_b0,1,&local_bc);
  glu::CallLogWrapper::glBindBuffer(&local_b0,0x8c2a,local_bc);
  glu::CallLogWrapper::glBufferData(&local_b0,0x8c2a,0x400,(void *)0x0,0x88e4);
  GVar6 = glu::CallLogWrapper::glGetError(&local_b0);
  if (GVar6 != 0) {
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Got Error ","");
    local_88 = glu::getErrorName;
    local_80 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_88);
    uVar10 = 0xf;
    if (local_e0 != local_d0) {
      uVar10 = local_d0[0];
    }
    if (uVar10 < local_100._M_string_length + local_d8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar11 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_100._M_string_length + local_d8) goto LAB_01631a4f;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
    }
    else {
LAB_01631a4f:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_130 = *plVar8;
      uStack_128 = puVar7[3];
    }
    else {
      local_130 = *plVar8;
      local_140 = (long *)*puVar7;
    }
    local_138 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160.field_2._8_8_ = plVar8[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_160._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"SizeAll","");
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Bind whole buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar3,&local_160,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexBuffer(&local_b0,0x8c2a,0x8236,local_bc);
  GVar6 = glu::CallLogWrapper::glGetError(&local_b0);
  if (GVar6 != 0) {
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Got Error ","");
    local_88 = glu::getErrorName;
    local_80 = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_88);
    uVar10 = 0xf;
    if (local_e0 != local_d0) {
      uVar10 = local_d0[0];
    }
    if (uVar10 < local_100._M_string_length + local_d8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        uVar11 = local_100.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_100._M_string_length + local_d8) goto LAB_01631d3a;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
    }
    else {
LAB_01631d3a:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
    }
    local_140 = &local_130;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_130 = *plVar8;
      uStack_128 = puVar7[3];
    }
    else {
      local_130 = *plVar8;
      local_140 = (long *)*puVar7;
    }
    local_138 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120.field_2._8_8_ = plVar8[3];
      local_120._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_120._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160.field_2._8_8_ = plVar8[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar9;
      local_160._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_160._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::ResultCollector::fail(&local_78,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
  }
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&local_78,&local_b0,0x8c2a,0,0x919e,0x400,this->m_type);
  tcu::TestLog::endSection((TestLog *)CONCAT44(local_b8.m_log._4_4_,(GLuint)local_b8.m_log));
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_160._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Partial","");
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Partial buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar3,&local_160,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexBufferRange(&local_b0,0x8c2a,0x8236,local_bc,0x100,0x200);
  GVar6 = glu::CallLogWrapper::glGetError(&local_b0);
  if (GVar6 == 0) goto LAB_01632208;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Got Error ","");
  local_88 = glu::getErrorName;
  local_80 = GVar6;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_88);
  uVar10 = 0xf;
  if (local_e0 != local_d0) {
    uVar10 = local_d0[0];
  }
  if (uVar10 < local_100._M_string_length + local_d8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      uVar11 = local_100.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_100._M_string_length + local_d8) goto LAB_0163206c;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_0163206c:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100._M_dataplus._M_p);
  }
  local_140 = &local_130;
  plVar8 = puVar7 + 2;
  if ((long *)*puVar7 == plVar8) {
    local_130 = *plVar8;
    uStack_128 = puVar7[3];
  }
  else {
    local_130 = *plVar8;
    local_140 = (long *)*puVar7;
  }
  local_138 = puVar7[1];
  *puVar7 = plVar8;
  puVar7[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120.field_2._8_8_ = plVar8[3];
    local_120._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar9;
    local_120._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_120._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_160.field_2._M_allocated_capacity = *psVar9;
    local_160.field_2._8_8_ = plVar8[3];
    local_160._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar9;
    local_160._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_160._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ResultCollector::fail(&local_78,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar1) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
LAB_01632208:
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&local_78,&local_b0,0x8c2a,0,0x919e,0x200,this->m_type);
  tcu::TestLog::endSection((TestLog *)CONCAT44(local_b8.m_log._4_4_,(GLuint)local_b8.m_log));
  glu::CallLogWrapper::glDeleteTextures(&local_b0,1,&local_8c);
  glu::CallLogWrapper::glDeleteBuffers(&local_b0,1,&local_bc);
  tcu::TestLog::endSection(local_98.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_78,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
    operator_delete(local_78.m_message._M_dataplus._M_p,
                    local_78.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_prefix._M_dataplus._M_p != &local_78.m_prefix.field_2) {
    operator_delete(local_78.m_prefix._M_dataplus._M_p,
                    local_78.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_b0);
  return STOP;
}

Assistant:

TextureBufferSizeQueryCase::IterateResult TextureBufferSizeQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// non-buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "NonBuffer", "Non-buffer");

		glw::GLuint	texture;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_2D, texture);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "gen texture");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_2D, 0, GL_TEXTURE_BUFFER_SIZE, 0, m_type);

		gl.glDeleteTextures(1, &texture);
	}

	// buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Buffer", "Texture buffer");

		glw::GLuint	texture;
		glw::GLuint	buffer;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_BUFFER, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind texture");

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		gl.glBufferData(GL_TEXTURE_BUFFER, 1024, DE_NULL, GL_STATIC_DRAW);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buf");

		{
			const tcu::ScopedLogSection subsection(m_testCtx.getLog(), "SizeAll", "Bind whole buffer");
			gl.glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "tex buffer");

			verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_BUFFER, 0, GL_TEXTURE_BUFFER_SIZE, 1024, m_type);
		}
		{
			const tcu::ScopedLogSection subsection(m_testCtx.getLog(), "Partial", "Partial buffer");
			gl.glTexBufferRange(GL_TEXTURE_BUFFER, GL_R32UI, buffer, 256, 512);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "tex buffer");

			verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_BUFFER, 0, GL_TEXTURE_BUFFER_SIZE, 512, m_type);
		}

		gl.glDeleteTextures(1, &texture);
		gl.glDeleteBuffers(1, &buffer);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}